

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
::InsertIntoBucketImpl<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           *this,unsigned_long *Key,unsigned_long *Lookup,
          DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *TheBucket)

{
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *in_RAX;
  uint AtLeast;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *local_28;
  
  AtLeast = *(uint *)(this + 0x10);
  if (*(uint *)(this + 8) * 4 + 4 < AtLeast * 3) {
    if (AtLeast >> 3 < (~*(uint *)(this + 8) + AtLeast) - *(int *)(this + 0xc)) goto LAB_00d66d58;
  }
  else {
    AtLeast = AtLeast * 2;
  }
  local_28 = in_RAX;
  DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
  ::grow((DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
          *)this,AtLeast);
  LookupBucketFor<unsigned_long>(this,Lookup,&local_28);
  TheBucket = local_28;
LAB_00d66d58:
  if (TheBucket != (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0) {
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
    if ((TheBucket->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).first !=
        0xffffffffffffffff) {
      *(int *)(this + 0xc) = *(int *)(this + 0xc) + -1;
    }
    return TheBucket;
  }
  __assert_fail("TheBucket",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x22f,
                "BucketT *llvm::DenseMapBase<llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, unsigned long, const llvm::DWARFDebugNames::NameIndex *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, KeyT = unsigned long, ValueT = const llvm::DWARFDebugNames::NameIndex *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, const llvm::DWARFDebugNames::NameIndex *>, LookupKeyT = unsigned long]"
               );
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }